

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxid.h
# Opt level: O1

void __thiscall soplex::SPxDevexPR<double>::left4(SPxDevexPR<double> *this,int n,SPxId id)

{
  int iVar1;
  SPxSolverBase<double> *pSVar2;
  pointer pdVar3;
  UpdateVector<double> *pUVar4;
  int *piVar5;
  pointer pdVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  
  if (id.super_DataKey.info != 0) {
    pSVar2 = (this->super_SPxPricer<double>).thesolver;
    pdVar3 = (pSVar2->theFvec->thedelta).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    dVar8 = 1.0 / pdVar3[n];
    dVar9 = SSVectorBase<double>::length2(&pSVar2->theCoPvec->thedelta);
    dVar8 = dVar9 * dVar8 * dVar8;
    pUVar4 = ((this->super_SPxPricer<double>).thesolver)->theFvec;
    lVar7 = (long)(pUVar4->thedelta).super_IdxSet.num;
    if (0 < lVar7) {
      piVar5 = (pUVar4->thedelta).super_IdxSet.idx;
      pdVar6 = (pSVar2->coWeights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 1;
      do {
        iVar1 = piVar5[lVar7 + -2];
        dVar9 = pdVar3[iVar1];
        pdVar6[iVar1] = dVar9 * dVar9 * dVar8 + pdVar6[iVar1];
        lVar7 = lVar7 + -1;
      } while (1 < lVar7);
    }
    (pSVar2->coWeights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[n] = dVar8;
  }
  return;
}

Assistant:

inline bool isValid() const
   {
      return info != 0;
   }